

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.hpp
# Opt level: O3

void __thiscall
Indexing::AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Rhs>::handleClause
          (AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Clause *c,bool adding)

{
  GenSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *pGVar1;
  StlIter __begin0;
  undefined1 local_180 [16];
  ulong local_170;
  int iStack_168;
  undefined4 uStack_164;
  undefined1 uStack_160;
  undefined3 uStack_15f;
  undefined1 uStack_15c;
  undefined7 uStack_15b;
  StlIter local_150;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  local_110;
  
  Inferences::ALASCA::BinaryResolutionConf::Rhs::iter
            (&local_110,
             (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,c);
  local_150._iter.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_&>
  .
  super_OptionBaseRef<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_*>
  ._elem = (OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_&>
            )(OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:80:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_&>
              )&local_110;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:80:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  ::tryNext(&local_150._cur,&local_110);
  pGVar1 = &this->_index;
  do {
    if (local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._isSome ==
        false) {
      if (local_110._iter._inner._inn._inn._inner._func.cmp.cmpCache.
          super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110._iter._inner._inn._inn._inner._func.cmp.cmpCache.
                   super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    if (local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem._elem.
        init.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._isSome == true) {
      uStack_160 = (undefined1)
                   ((ulong)local_150._cur.
                           super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                           _elem._25_8_ >> 0x38);
      iStack_168._1_3_ =
           (uint3)local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>.
                  _elem._elem._25_8_;
      uStack_164 = (undefined4)
                   ((ulong)local_150._cur.
                           super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                           _elem._25_8_ >> 0x18);
      uStack_15c = (undefined1)
                   ((uint)local_150._cur.
                          super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>._elem.
                          _elem._33_4_ >> 0x18);
      uStack_15f = (undefined3)
                   local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>.
                   _elem._elem._33_4_;
      if (!adding) {
        uStack_15b = 0;
        local_170._0_5_ =
             CONCAT41(local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>
                      ._elem._elem._17_4_,
                      local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>
                      ._elem._elem._16_1_) & 0xffffffff03;
        local_170 = (ulong)(uint5)local_170;
        iStack_168 = (uint)iStack_168._1_3_ << 8;
        goto LAB_00359c81;
      }
      uStack_15b = 0;
      local_170._0_5_ =
           CONCAT41(local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>.
                    _elem._elem._17_4_,
                    local_150._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Rhs>.
                    _elem._elem._16_1_) & 0xffffffff03;
      local_170 = (ulong)(uint5)local_170;
      iStack_168 = (uint)iStack_168._1_3_ << 8;
LAB_00359c25:
      (*(pGVar1->super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>).
        _vptr_LiteralIndexingStructure[2])(pGVar1,local_180,1);
    }
    else {
      if (adding) goto LAB_00359c25;
LAB_00359c81:
      (*(pGVar1->super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>).
        _vptr_LiteralIndexingStructure[2])(pGVar1,local_180,0);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:80:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:81:19),_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
    ::StlIter::operator++(&local_150);
  } while( true );
}

Assistant:

virtual void handleClause(Clause* c, bool adding) final override
  {
    TIME_TRACE(_maintainanceStr.c_str())
    for (auto appl : T::iter(*_shared, c)) {
      if (adding) {
#if VDEBUG
        auto k = appl.key();
#endif
        _index.insert(std::move(appl));
        DEBUG_CODE(
        auto state = AbstractingUnifier::empty(AbstractionOracle(Shell::Options::UnificationWithAbstraction::OFF));
        )
        ASS_REP(find<RetrievalAlgorithms::DefaultVarBanks>(&state, k).hasNext(), Output::cat("key: ", Output::ptr(k), "\nindex: ", Output::multiline(_index)))
      } else {
        _index.remove(std::move(appl));
      }
    }
  }